

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlfparser.h
# Opt level: O0

vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *
xlfparser::_fix_whitespace_tokens<char>
          (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *__return_storage_ptr__,
          vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *tokens,char *formula,
          size_t size)

{
  bool bVar1;
  Type TVar2;
  Subtype SVar3;
  size_type __n;
  size_t start;
  size_t end;
  bool local_c5;
  Token local_a8;
  __normal_iterator<const_xlfparser::Token_*,_std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>_>
  local_90;
  reference local_88;
  Token *next;
  reference local_78;
  Token *previous;
  __normal_iterator<const_xlfparser::Token_*,_std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>_>
  local_68;
  __normal_iterator<const_xlfparser::Token_*,_std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>_>
  local_60;
  value_type *local_58;
  Token *token;
  __normal_iterator<const_xlfparser::Token_*,_std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>_>
  local_48;
  const_iterator iter;
  size_t size_local;
  char *formula_local;
  vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *tokens_local;
  vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *new_tokens;
  
  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::vector(__return_storage_ptr__);
  __n = std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::size(tokens);
  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::reserve
            (__return_storage_ptr__,__n);
  local_48._M_current =
       (Token *)std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::begin(tokens);
  while( true ) {
    token = (Token *)std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::end(tokens);
    bVar1 = __gnu_cxx::
            operator==<const_xlfparser::Token_*,_std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>_>
                      (&local_48,
                       (__normal_iterator<const_xlfparser::Token_*,_std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>_>
                        *)&token);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_58 = __gnu_cxx::
               __normal_iterator<const_xlfparser::Token_*,_std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>_>
               ::operator*(&local_48);
    TVar2 = Token::type(local_58);
    if (TVar2 == Whitespace) {
      local_60._M_current =
           (Token *)std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::begin(tokens);
      bVar1 = __gnu_cxx::
              operator==<const_xlfparser::Token_*,_std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>_>
                        (&local_48,&local_60);
      local_c5 = true;
      if (!bVar1) {
        previous = (Token *)std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::end
                                      (tokens);
        local_68 = __gnu_cxx::
                   __normal_iterator<const_xlfparser::Token_*,_std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>_>
                   ::operator-((__normal_iterator<const_xlfparser::Token_*,_std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>_>
                                *)&previous,1);
        local_c5 = __gnu_cxx::
                   operator==<const_xlfparser::Token_*,_std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>_>
                             (&local_48,&local_68);
      }
      if (local_c5 == false) {
        next = (Token *)__gnu_cxx::
                        __normal_iterator<const_xlfparser::Token_*,_std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>_>
                        ::operator-(&local_48,1);
        local_78 = __gnu_cxx::
                   __normal_iterator<const_xlfparser::Token_*,_std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>_>
                   ::operator*((__normal_iterator<const_xlfparser::Token_*,_std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>_>
                                *)&next);
        local_90 = __gnu_cxx::
                   __normal_iterator<const_xlfparser::Token_*,_std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>_>
                   ::operator+(&local_48,1);
        local_88 = __gnu_cxx::
                   __normal_iterator<const_xlfparser::Token_*,_std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>_>
                   ::operator*(&local_90);
        TVar2 = Token::type(local_78);
        if (((((TVar2 == Function) && (SVar3 = Token::subtype(local_78), SVar3 == Stop)) ||
             ((TVar2 = Token::type(local_78), TVar2 == Subexpression &&
              (SVar3 = Token::subtype(local_78), SVar3 == Stop)))) ||
            (TVar2 = Token::type(local_78), TVar2 == Operand)) &&
           (((TVar2 = Token::type(local_88), TVar2 == Function &&
             (SVar3 = Token::subtype(local_88), SVar3 == Start)) ||
            (((TVar2 = Token::type(local_88), TVar2 == Subexpression &&
              (SVar3 = Token::subtype(local_88), SVar3 == Start)) ||
             (TVar2 = Token::type(local_88), TVar2 == Operand)))))) {
          start = Token::start(local_58);
          end = Token::end(local_58);
          Token::Token(&local_a8,start,end,OperatorInfix,Intersection);
          std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                    (__return_storage_ptr__,&local_a8);
        }
      }
    }
    else {
      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::push_back
                (__return_storage_ptr__,local_58);
    }
    __gnu_cxx::
    __normal_iterator<const_xlfparser::Token_*,_std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>_>
    ::operator++(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<Token> _fix_whitespace_tokens(const std::vector<Token> tokens,
                                                     const char_type* formula,
                                                     size_t size)
    {
        std::vector<Token> new_tokens;
        new_tokens.reserve(tokens.size());

        for (auto iter = tokens.begin(); iter != tokens.end(); ++iter)
        {
            auto& token = *iter;
            if (token.type() != Token::Type::Whitespace)
            {
                new_tokens.push_back(token);
                continue;
            }

            // Examine the previous and next tokens to see if the whitepsace is actually an intersection operator
            if (iter == tokens.begin() || iter == tokens.end()-1)
                continue;

            auto& previous = *(iter-1);
            auto& next = *(iter+1);

            // If the previous token is not the end of a function, subexpression or operand skip the whitespace
            if (!((previous.type() == Token::Type::Function && previous.subtype() == Token::Subtype::Stop) ||
                  (previous.type() == Token::Type::Subexpression && previous.subtype() == Token::Subtype::Stop) ||
                  (previous.type() == Token::Type::Operand)))
                continue;

            // If the next token is not the start of a function, subexpression or operand skip the whitespace
            if (!((next.type() == Token::Type::Function && next.subtype() == Token::Subtype::Start) ||
                  (next.type() == Token::Type::Subexpression && next.subtype() == Token::Subtype::Start) ||
                  (next.type() == Token::Type::Operand)))
                continue;

            // Space between functions, subexpressions or operands is an intersection operator
            new_tokens.push_back({token.start(),
                                  token.end(),
                                  Token::Type::OperatorInfix,
                                  Token::Subtype::Intersection});
        }

        return new_tokens;
    }